

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O0

DecInfo * __thiscall PriorityBranchGroup::branch(PriorityBranchGroup *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Branching **ppBVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vec<int> *pvVar6;
  uint *puVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long in_RDI;
  double extraout_XMM0_Qa;
  uniform_int_distribution<int> rnd_move_1;
  int best_i;
  double s;
  uint i_2;
  double best;
  int best_i_1;
  uniform_int_distribution<int> rnd_move;
  uint i_1;
  uint i;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  bool dealloc;
  vec<int> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  vec<int> *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint local_48;
  uint local_34;
  double local_30;
  uint local_18;
  uint local_14;
  DecInfo *local_8;
  
  iVar1 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x24));
  if (-1 < iVar1) {
    uVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x24));
    ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),uVar2);
    uVar2 = (**(*ppBVar5)->_vptr_Branching)();
    if ((uVar2 & 1) == 0) {
      uVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x24));
      ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),uVar2);
      iVar1 = (*(*ppBVar5)->_vptr_Branching[2])();
      return (DecInfo *)CONCAT44(extraout_var,iVar1);
    }
  }
  if (*(int *)(in_RDI + 0x18) == 1) {
    local_14 = 0;
    while( true ) {
      uVar2 = local_14;
      uVar3 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 0x38));
      in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 & 0xffffff;
      if (uVar2 < uVar3) {
        ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),local_14);
        iVar1 = (**(*ppBVar5)->_vptr_Branching)();
        in_stack_ffffffffffffff94 = CONCAT13((char)iVar1,(int3)in_stack_ffffffffffffff94);
      }
      if ((in_stack_ffffffffffffff94 & 0x1000000) == 0) break;
      local_14 = local_14 + 1;
    }
    uVar3 = local_14;
    uVar4 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 0x38));
    if (uVar3 == uVar4) {
      local_8 = (DecInfo *)0x0;
    }
    else {
      if ((*(byte *)(in_RDI + 0x1c) & 1) == 0) {
        Tint::operator=((Tint *)CONCAT44(in_stack_ffffffffffffff94,uVar2),uVar3);
      }
      ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),local_14);
      iVar1 = (*(*ppBVar5)->_vptr_Branching[2])();
      local_8 = (DecInfo *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    dealloc = SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0);
    if (*(int *)(in_RDI + 0x18) == 0xf) {
      vec<int>::clear(in_stack_ffffffffffffff70,dealloc);
      for (local_18 = 0; uVar2 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 0x38)),
          local_18 < uVar2; local_18 = local_18 + 1) {
        ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),local_18);
        uVar2 = (**(*ppBVar5)->_vptr_Branching)();
        if ((uVar2 & 1) == 0) {
          vec<int>::push(in_stack_ffffffffffffff80,
                         (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
      }
      uVar2 = vec<int>::size((vec<int> *)(in_RDI + 0x28));
      if (uVar2 == 0) {
        local_8 = (DecInfo *)0x0;
      }
      else {
        vec<int>::size((vec<int> *)(in_RDI + 0x28));
        std::uniform_int_distribution<int>::uniform_int_distribution
                  ((uniform_int_distribution<int> *)in_stack_ffffffffffffff70,
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        pvVar6 = (vec<int> *)(in_RDI + 0x28);
        uVar2 = std::uniform_int_distribution<int>::operator()
                          ((uniform_int_distribution<int> *)in_stack_ffffffffffffff70,
                           (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        puVar7 = (uint *)vec<int>::operator[](pvVar6,uVar2);
        uVar2 = *puVar7;
        if ((*(byte *)(in_RDI + 0x1c) & 1) == 0) {
          Tint::operator=((Tint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c);
        }
        ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),uVar2);
        iVar1 = (*(*ppBVar5)->_vptr_Branching[2])();
        local_8 = (DecInfo *)CONCAT44(extraout_var_01,iVar1);
      }
    }
    else {
      local_30 = -1e+100;
      vec<int>::clear(in_stack_ffffffffffffff70,dealloc);
      local_34 = 0;
      while (uVar2 = local_34, uVar3 = vec<Branching_*>::size((vec<Branching_*> *)(in_RDI + 0x38)),
            uVar2 < uVar3) {
        ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),local_34);
        uVar3 = (**(*ppBVar5)->_vptr_Branching)();
        if ((uVar3 & 1) == 0) {
          ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 8),local_34);
          (*(*ppBVar5)->_vptr_Branching[1])();
          if (local_30 <= extraout_XMM0_Qa) {
            if (local_30 < extraout_XMM0_Qa) {
              vec<int>::clear(in_stack_ffffffffffffff70,
                              SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
              local_30 = extraout_XMM0_Qa;
            }
            vec<int>::push(in_stack_ffffffffffffff80,
                           (int *)CONCAT44(uVar2,in_stack_ffffffffffffff78));
          }
        }
        local_34 = local_34 + 1;
      }
      uVar2 = vec<int>::size((vec<int> *)(in_RDI + 0x28));
      if (uVar2 == 0) {
        local_8 = (DecInfo *)0x0;
      }
      else {
        puVar7 = (uint *)vec<int>::operator[]((vec<int> *)(in_RDI + 0x28),0);
        local_48 = *puVar7;
        if ((so.branch_random & 1U) != 0) {
          vec<int>::size((vec<int> *)(in_RDI + 0x28));
          std::uniform_int_distribution<int>::uniform_int_distribution
                    ((uniform_int_distribution<int> *)in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
          pvVar6 = (vec<int> *)(in_RDI + 0x28);
          uVar2 = std::uniform_int_distribution<int>::operator()
                            ((uniform_int_distribution<int> *)pvVar6,
                             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                              *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          puVar7 = (uint *)vec<int>::operator[](pvVar6,uVar2);
          local_48 = *puVar7;
        }
        if ((*(byte *)(in_RDI + 0x1c) & 1) == 0) {
          Tint::operator=((Tint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c);
        }
        ppBVar5 = vec<Branching_*>::operator[]((vec<Branching_*> *)(in_RDI + 0x38),local_48);
        iVar1 = (*(*ppBVar5)->_vptr_Branching[2])();
        local_8 = (DecInfo *)CONCAT44(extraout_var_02,iVar1);
      }
    }
  }
  return local_8;
}

Assistant:

DecInfo* PriorityBranchGroup::branch() {
	// Check whether the current branching group has finished,
	// if not yet then continue search with this one
	if (cur >= 0 && !annotations[cur]->finished()) {
		return annotations[cur]->branch();
	}

	/* Select the next branching group */

	// Special case of input order selection
	if (var_branch == VAR_INORDER) {
		unsigned int i = 0;
		while (i < annotations.size() && annotations[i]->finished()) {
			i++;
		}
		if (i == annotations.size()) {
			return nullptr;
		}
		if (!terminal) {
			cur = i;
		}
		return annotations[i]->branch();
	}
	// Special case of random order selection
	if (var_branch == VAR_RANDOM) {
		moves.clear();
		for (unsigned int i = 0; i < annotations.size(); i++) {
			if (!annotations[i]->finished()) {
				moves.push(i);
			}
		}
		if (moves.size() == 0) {
			return nullptr;
		}
		std::uniform_int_distribution<int> rnd_move(0, moves.size() - 1);
		const int best_i = moves[rnd_move(engine.rnd)];
		if (!terminal) {
			cur = best_i;
		}
		return annotations[best_i]->branch();
	}

	// All other selection strategies
	double best = -1e100;
	moves.clear();
	for (unsigned int i = 0; i < annotations.size(); i++) {
		if (annotations[i]->finished()) {
			continue;
		}
		const double s = x[i]->getScore(var_branch);
		if (s >= best) {
			if (s > best) {
				best = s;
				moves.clear();
			}
			moves.push(i);
		}
	}
	if (moves.size() == 0) {
		return nullptr;
	}
	int best_i = moves[0];
	// Special case of random selection of best moves
	if (so.branch_random) {
		std::uniform_int_distribution<int> rnd_move(0, moves.size() - 1);
		best_i = moves[rnd_move(engine.rnd)];
	}

	if (!terminal) {
		cur = best_i;
	}
	return annotations[best_i]->branch();
}